

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O1

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_values
          (mbedtls_cipher_id_t cipher_id,int key_bitlen,mbedtls_cipher_mode_t mode)

{
  uint uVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t **ppmVar3;
  
  pmVar2 = &aes_128_ecb_info;
  ppmVar3 = &mbedtls_cipher_definitions[1].info;
  while (((uVar1 = *(uint *)&pmVar2->field_0x8,
          **(mbedtls_cipher_id_t **)
            ((long)mbedtls_cipher_base_lookup_table + (ulong)(uVar1 >> 0x17 & 0xf8)) != cipher_id ||
          ((uVar1 >> 2 & 0x3c0) != key_bitlen)) ||
         ((uVar1 >> 0xc & (MBEDTLS_MODE_KW|MBEDTLS_MODE_CFB)) != mode))) {
    pmVar2 = *ppmVar3;
    ppmVar3 = ppmVar3 + 2;
    if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
      return (mbedtls_cipher_info_t *)0x0;
    }
  }
  return pmVar2;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_values(
    const mbedtls_cipher_id_t cipher_id,
    int key_bitlen,
    const mbedtls_cipher_mode_t mode)
{
    const mbedtls_cipher_definition_t *def;

    for (def = mbedtls_cipher_definitions; def->info != NULL; def++) {
        if (mbedtls_cipher_get_base(def->info)->cipher == cipher_id &&
            mbedtls_cipher_info_get_key_bitlen(def->info) == (unsigned) key_bitlen &&
            def->info->mode == mode) {
            return def->info;
        }
    }

    return NULL;
}